

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexMainWriter::~PtexMainWriter(PtexMainWriter *this)

{
  PtexWriterBase *in_RDI;
  vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *unaff_retaddr;
  
  (in_RDI->super_PtexWriter)._vptr_PtexWriter = (_func_int **)&PTR__PtexMainWriter_00141b90;
  if (*(long *)&in_RDI[1]._pixelSize != 0) {
    (**(code **)(**(long **)&in_RDI[1]._pixelSize + 0x10))();
  }
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)unaff_retaddr);
  std::
  vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
  ::~vector((vector<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
             *)unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)in_RDI[1]._error.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  PtexWriterBase::~PtexWriterBase(in_RDI);
  return;
}

Assistant:

PtexMainWriter::~PtexMainWriter()
{
    if (_reader) _reader->release();
}